

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UT_OK.cpp
# Opt level: O3

void __thiscall reference_no_default5::test_method(reference_no_default5 *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  assertion_result local_1c8;
  char ****local_1b0;
  undefined **local_1a8;
  ulong uStack_1a0;
  undefined8 *local_198;
  int ***local_190;
  undefined1 *local_180;
  undefined1 *local_178;
  shared_count sStack_170;
  vector<int,_std::allocator<int>_> v;
  int local_14c;
  undefined **local_148;
  char *local_140;
  undefined8 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  vector<int,_std::allocator<int>_> x;
  undefined8 local_100;
  char **local_f8;
  undefined1 *local_f0;
  int *local_e8;
  char *local_e0;
  undefined8 *local_d8;
  char ***local_d0;
  undefined1 *local_c8;
  int **local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1a8 = (undefined **)0x200000001;
  uStack_1a0 = 0x400000003;
  local_198._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_1a8;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&local_1c8);
  local_1a8 = (undefined **)0xc0000000b;
  uStack_1a0 = 0xe0000000d;
  local_198 = (undefined8 *)CONCAT44(local_198._4_4_,0xf);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1a8;
  std::vector<int,_std::allocator<int>_>::vector(&x,__l_00,(allocator_type *)&local_1c8);
  local_14c = 0x2a;
  local_100 = 0x4029000000000000;
  local_c0 = (int **)0x111086;
  local_b8 = "";
  local_d0 = (char ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x112);
  local_140 = (char *)((ulong)local_140 & 0xffffffffffffff00);
  local_148 = &PTR__lazy_ostream_00115a30;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_e8 = &local_14c;
  local_f8 = &local_88;
  local_88 = (char *)CONCAT44(local_88._4_4_,0x2a);
  local_178 = (undefined1 *)0x0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_120 = "";
  local_190 = (int ***)&local_e8;
  uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  local_1a8 = &PTR__lazy_ostream_00115a80;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = (char ****)&local_f8;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8._0_8_ = &PTR__lazy_ostream_00115a80;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_180._0_1_ = local_14c == 0x2a;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_e8 = (int *)0x111086;
  local_e0 = "";
  local_f8 = (char **)&boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x115);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_1c8,(equal_coll_impl *)&local_148,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  local_1a8 = &PTR__lazy_ostream_00115a30;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = (int ***)0x111356;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_80 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_1a8,&local_88,0x115,1,0xd,4,"std::begin(b)","std::end(b)",
             "std::begin(v)","std::end(v)");
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x116);
  local_140 = (char *)((ulong)local_140 & 0xffffffffffffff00);
  local_148 = &PTR__lazy_ostream_00115a30;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  boost::test_tools::tt_detail::equal_impl((char *)&local_180,"foo");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_120 = "";
  local_190 = (int ***)&local_98;
  local_98 = "foo";
  uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  local_1a8 = &PTR__lazy_ostream_00115b00;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = (char ****)&local_a8;
  local_a8 = "foo";
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8._0_8_ = &PTR__lazy_ostream_00115b00;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,&local_148,&local_128,0x116,1,2,2,"c",&local_1a8,"\"foo\"",&local_1c8);
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_90 = "";
  local_a8 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x117);
  local_140 = (char *)((ulong)local_140 & 0xffffffffffffff00);
  local_148 = &PTR__lazy_ostream_00115a30;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_78 = &local_b0;
  local_b0 = 0x4029000000000000;
  local_180 = (undefined1 *)CONCAT71(local_180._1_7_,1);
  local_178 = (undefined1 *)0x0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_120 = "";
  local_d8 = &local_100;
  local_190 = (int ***)&local_d8;
  uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  local_1a8 = &PTR__lazy_ostream_00115b80;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = (char ****)&local_78;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8._0_8_ = &PTR__lazy_ostream_00115b80;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_170);
  local_148 = (undefined **)0x111086;
  local_140 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x11a,&local_180);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_1c8,(equal_coll_impl *)&local_d8,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  local_1a8 = &PTR__lazy_ostream_00115a30;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = (int ***)0x111356;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_1a8,&local_128,0x11a,1,0xd,4,"std::begin(e)","std::end(e)",
             "std::begin(x)","std::end(x)");
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_1a8 = (undefined **)CONCAT44(local_1a8._4_4_,0x2a);
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&v,(iterator)
                  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish,(int *)&local_1a8);
  }
  else {
    *v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         0x2a;
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish +
         1;
  }
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x122);
  local_140 = (char *)((ulong)local_140 & 0xffffffffffffff00);
  local_148 = &PTR__lazy_ostream_00115a30;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_e8 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  local_f8 = (char **)CONCAT44(local_f8._4_4_,6);
  local_180 = (undefined1 *)
              CONCAT71(local_180._1_7_,
                       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x18);
  local_178 = (undefined1 *)0x0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
  ;
  local_120 = "";
  local_c0 = &local_e8;
  uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  local_1a8 = &PTR__lazy_ostream_00115d30;
  local_198 = &boost::unit_test::lazy_ostream::inst;
  local_190 = &local_c0;
  local_d0 = &local_f8;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8._0_8_ = &PTR__lazy_ostream_00115a80;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1b0 = &local_d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_170);
  if (x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(reference_no_default5)
{
    auto       v = std::vector<int>{ 1, 2, 3, 4, 5};
    auto const x = std::vector<int>{ 11, 12, 13, 14, 15};
    f_reference_no_default5(
            [&](auto&& a, auto&& b, auto&& c, auto&& d, auto&& e) {
            BOOST_CHECK_EQUAL(a, 42);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(b), std::end(b),
                    std::begin(v), std::end(v));
            BOOST_CHECK_EQUAL(c, "foo");
            BOOST_CHECK_EQUAL(d, 12.5);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(e), std::end(e),
                    std::begin(x), std::end(x));
            },
            "a"_na=42,
            "b"_na=v,
            "c"_na="foo",
            "d"_na=12.5,
            "e"_na=x
            );
    BOOST_CHECK_EQUAL(v.size(), 6); // check v was copied
}